

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_context_open_pcm__alsa
                    (ma_context *pContext,ma_share_mode shareMode,ma_device_type deviceType,
                    ma_device_id *pDeviceID,wchar_t openMode,ma_snd_pcm_t **ppPCM)

{
  wchar_t wVar1;
  int iVar2;
  ma_result mVar3;
  char *pcVar4;
  char *pcVar5;
  ma_device_id_conflict *pmVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  ma_snd_pcm_t *pPCM;
  ma_snd_pcm_t **local_240;
  ma_device_id_conflict deviceID;
  char hwid [256];
  
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a46,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  if (ppPCM == (ma_snd_pcm_t **)0x0) {
    __assert_fail("ppPCM != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x3a47,
                  "ma_result ma_context_open_pcm__alsa(ma_context *, ma_share_mode, ma_device_type, const ma_device_id *, int, ma_snd_pcm_t **)"
                 );
  }
  *ppPCM = (ma_snd_pcm_t *)0x0;
  pPCM = (ma_snd_pcm_t *)0x0;
  uVar9 = (ulong)(deviceType != ma_device_type_playback);
  local_240 = ppPCM;
  if (pDeviceID == (ma_device_id *)0x0) {
    deviceID._48_8_ = 0;
    deviceID._32_8_ = 0;
    deviceID._40_8_ = 0;
    deviceID.wasapi[0] = L'\x001a27b6';
    deviceID.wasapi[1] = L'\0';
    if (shareMode == ma_share_mode_exclusive) {
      deviceID._8_8_ = anon_var_dwarf_64eebb;
      deviceID._16_8_ = anon_var_dwarf_64eec7;
      deviceID._24_8_ = anon_var_dwarf_64eed3;
    }
    else {
      bVar10 = deviceType != ma_device_type_playback;
      pcVar4 = "dmix";
      if (bVar10) {
        pcVar4 = "dsnoop";
      }
      pcVar5 = "dmix:0";
      if (bVar10) {
        pcVar5 = "dsnoop:0";
      }
      pcVar7 = "dmix:0,0";
      if (bVar10) {
        pcVar7 = "dsnoop:0,0";
      }
      deviceID._8_8_ = pcVar4;
      deviceID._16_8_ = pcVar5;
      deviceID._24_8_ = pcVar7;
      deviceID._32_8_ = anon_var_dwarf_64eebb;
      deviceID._40_8_ = anon_var_dwarf_64eec7;
      deviceID._48_8_ = anon_var_dwarf_64eed3;
    }
    lVar8 = 0;
    while( true ) {
      if (lVar8 == 7) {
        ma_log_postf(pContext->pLog,1,
                     "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device."
                    );
        return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
      }
      pcVar4 = *(char **)(hwid + lVar8 * 8 + -0x100);
      if (((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) &&
         (iVar2 = (*(pContext->field_14).alsa.snd_pcm_open)
                            (&pPCM,pcVar4,uVar9,(ulong)(uint)openMode), iVar2 == 0)) break;
      lVar8 = lVar8 + 1;
    }
    goto LAB_0019b555;
  }
  memcpy(&deviceID,pDeviceID,0x100);
  if (deviceID.dsound[0] == ':') {
    if (deviceID.dsound[1] == '\0') {
      deviceID.winmm = deviceID.winmm & 0xffffff00;
    }
    iVar2 = -0x13;
    if (shareMode == ma_share_mode_shared) {
      pcVar4 = "dmix";
      if (deviceType != ma_device_type_playback) {
        pcVar4 = "dsnoop";
      }
      ma_strcpy_s(hwid,0x100,pcVar4);
      wVar1 = ma_strcat_s(hwid,0x100,deviceID.alsa);
      if ((wVar1 != L'\0') ||
         (iVar2 = (*(pContext->field_14).alsa.snd_pcm_open)(&pPCM,hwid,uVar9,(ulong)(uint)openMode),
         iVar2 != 0)) goto LAB_0019b498;
      iVar2 = 0;
    }
    else {
LAB_0019b498:
      ma_strcpy_s(hwid,0x100,"hw");
      wVar1 = ma_strcat_s(hwid,0x100,deviceID.alsa);
      if (wVar1 == L'\0') {
        pmVar6 = (ma_device_id_conflict *)hwid;
        goto LAB_0019b541;
      }
    }
  }
  else {
    pmVar6 = &deviceID;
LAB_0019b541:
    iVar2 = (*(pContext->field_14).alsa.snd_pcm_open)(&pPCM,pmVar6,uVar9,(ulong)(uint)openMode);
  }
  if (iVar2 < 0) {
    ma_log_postf(pContext->pLog,1,"[ALSA] snd_pcm_open() failed.");
    mVar3 = ma_result_from_errno(-iVar2);
    return mVar3;
  }
LAB_0019b555:
  *local_240 = pPCM;
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_context_open_pcm__alsa(ma_context* pContext, ma_share_mode shareMode, ma_device_type deviceType, const ma_device_id* pDeviceID, int openMode, ma_snd_pcm_t** ppPCM)
{
    ma_snd_pcm_t* pPCM;
    ma_snd_pcm_stream_t stream;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(ppPCM != NULL);

    *ppPCM = NULL;
    pPCM = NULL;

    stream = (deviceType == ma_device_type_playback) ? MA_SND_PCM_STREAM_PLAYBACK : MA_SND_PCM_STREAM_CAPTURE;

    if (pDeviceID == NULL) {
        ma_bool32 isDeviceOpen;
        size_t i;

        /*
        We're opening the default device. I don't know if trying anything other than "default" is necessary, but it makes
        me feel better to try as hard as we can get to get _something_ working.
        */
        const char* defaultDeviceNames[] = {
            "default",
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
        };

        if (shareMode == ma_share_mode_exclusive) {
            defaultDeviceNames[1] = "hw";
            defaultDeviceNames[2] = "hw:0";
            defaultDeviceNames[3] = "hw:0,0";
        } else {
            if (deviceType == ma_device_type_playback) {
                defaultDeviceNames[1] = "dmix";
                defaultDeviceNames[2] = "dmix:0";
                defaultDeviceNames[3] = "dmix:0,0";
            } else {
                defaultDeviceNames[1] = "dsnoop";
                defaultDeviceNames[2] = "dsnoop:0";
                defaultDeviceNames[3] = "dsnoop:0,0";
            }
            defaultDeviceNames[4] = "hw";
            defaultDeviceNames[5] = "hw:0";
            defaultDeviceNames[6] = "hw:0,0";
        }

        isDeviceOpen = MA_FALSE;
        for (i = 0; i < ma_countof(defaultDeviceNames); ++i) {
            if (defaultDeviceNames[i] != NULL && defaultDeviceNames[i][0] != '\0') {
                if (((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, defaultDeviceNames[i], stream, openMode) == 0) {
                    isDeviceOpen = MA_TRUE;
                    break;
                }
            }
        }

        if (!isDeviceOpen) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed when trying to open an appropriate default device.");
            return MA_FAILED_TO_OPEN_BACKEND_DEVICE;
        }
    } else {
        /*
        We're trying to open a specific device. There's a few things to consider here:

        miniaudio recongnizes a special format of device id that excludes the "hw", "dmix", etc. prefix. It looks like this: ":0,0", ":0,1", etc. When
        an ID of this format is specified, it indicates to miniaudio that it can try different combinations of plugins ("hw", "dmix", etc.) until it
        finds an appropriate one that works. This comes in very handy when trying to open a device in shared mode ("dmix"), vs exclusive mode ("hw").
        */

        /* May end up needing to make small adjustments to the ID, so make a copy. */
        ma_device_id deviceID = *pDeviceID;
        int resultALSA = -ENODEV;

        if (deviceID.alsa[0] != ':') {
            /* The ID is not in ":0,0" format. Use the ID exactly as-is. */
            resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, deviceID.alsa, stream, openMode);
        } else {
            char hwid[256];

            /* The ID is in ":0,0" format. Try different plugins depending on the shared mode. */
            if (deviceID.alsa[1] == '\0') {
                deviceID.alsa[0] = '\0';  /* An ID of ":" should be converted to "". */
            }

            if (shareMode == ma_share_mode_shared) {
                if (deviceType == ma_device_type_playback) {
                    ma_strcpy_s(hwid, sizeof(hwid), "dmix");
                } else {
                    ma_strcpy_s(hwid, sizeof(hwid), "dsnoop");
                }

                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }

            /* If at this point we still don't have an open device it means we're either preferencing exclusive mode or opening with "dmix"/"dsnoop" failed. */
            if (resultALSA != 0) {
                ma_strcpy_s(hwid, sizeof(hwid), "hw");
                if (ma_strcat_s(hwid, sizeof(hwid), deviceID.alsa) == 0) {
                    resultALSA = ((ma_snd_pcm_open_proc)pContext->alsa.snd_pcm_open)(&pPCM, hwid, stream, openMode);
                }
            }
        }

        if (resultALSA < 0) {
            ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_ERROR, "[ALSA] snd_pcm_open() failed.");
            return ma_result_from_errno(-resultALSA);
        }
    }

    *ppPCM = pPCM;
    return MA_SUCCESS;
}